

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall ExternalTester::testAllPWLocal(ExternalTester *this)

{
  allocator<int> *paVar1;
  pointer *this_00;
  double dVar2;
  double dVar3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  bool bVar4;
  pointer pdVar5;
  TypeOneDRule TVar6;
  bool bVar7;
  _Setw _Var8;
  int *piVar9;
  double *pdVar10;
  ostream *poVar11;
  reference pvVar12;
  reference pvVar13;
  TypeOneDRule rule;
  TypeOneDRule rule_00;
  TypeOneDRule rule_01;
  TypeOneDRule rule_02;
  TypeOneDRule rule_03;
  TypeOneDRule rule_04;
  TypeOneDRule rule_05;
  TypeOneDRule rule_06;
  vector<double,_std::allocator<double>_> *this_01;
  double extraout_XMM0_Qa;
  int local_818;
  int local_814;
  int i_1;
  int j;
  int i;
  vector<double,_std::allocator<double>_> y;
  double *coeff;
  vector<double,_std::allocator<double>_> local_7d8;
  undefined1 local_7b8 [8];
  vector<double,_std::allocator<double>_> pnts;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> pntr;
  vector<int,_std::allocator<int>_> indx;
  TasGrid local_738 [8];
  TasmanianSparseGrid grid;
  string local_6b0;
  int local_68c;
  int local_688;
  int local_684;
  string local_680;
  int local_65c;
  int local_658;
  allocator<double> local_651;
  double local_650 [30];
  iterator local_560;
  size_type local_558;
  undefined1 local_550 [8];
  vector<double,_std::allocator<double>_> tols1_3;
  undefined1 local_530 [8];
  vector<int,_std::allocator<int>_> depths1_3;
  TypeOneDRule oned_3;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  string local_4e0;
  int local_4bc;
  int local_4b8;
  allocator<double> local_4b1;
  double local_4b0 [30];
  iterator local_3c0;
  size_type local_3b8;
  undefined1 local_3b0 [8];
  vector<double,_std::allocator<double>_> tols1_2;
  undefined1 local_390 [8];
  vector<int,_std::allocator<int>_> depths1_2;
  TypeOneDRule oned_2;
  int local_34c;
  int local_348;
  int local_344;
  string local_340;
  int local_31c;
  int local_318;
  allocator<double> local_311;
  double local_310 [30];
  iterator local_220;
  size_type local_218;
  undefined1 local_210 [8];
  vector<double,_std::allocator<double>_> tols1_1;
  undefined1 local_1f0 [8];
  vector<int,_std::allocator<int>_> depths1_1;
  TypeOneDRule oned_1;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  string local_1a0;
  int local_17c;
  int local_178;
  allocator<double> local_171;
  double local_170 [30];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> tols1;
  allocator<int> local_45;
  value_type_conflict2 local_44;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> depths1;
  TypeOneDRule oned;
  int wthird;
  int wsecond;
  int wfirst;
  bool pass;
  ExternalTester *this_local;
  
  bVar4 = true;
  depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = rule_semilocalp;
  local_44 = 8;
  std::allocator<int>::allocator(&local_45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,0x1e,&local_44,&local_45);
  std::allocator<int>::~allocator(&local_45);
  memcpy(local_170,&DAT_0018d3f0,0xf0);
  local_78 = 0x1e;
  local_80 = local_170;
  std::allocator<double>::allocator(&local_171);
  __l_02._M_len = local_78;
  __l_02._M_array = local_80;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,__l_02,&local_171);
  std::allocator<double>::~allocator(&local_171);
  TVar6 = depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_40);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_70);
  bVar7 = testLocalPolynomialRule(this,&(this->f21nx2).super_BaseFunction,TVar6,piVar9,pdVar10);
  if (bVar7) {
    if ((this->verbose & 1U) != 0) {
      local_178 = (int)std::setw(10);
      poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_178);
      poVar11 = std::operator<<(poVar11,"Rule");
      local_17c = (int)std::setw(0x23);
      poVar11 = std::operator<<(poVar11,(_Setw)local_17c);
      TasGrid::IO::getRuleString_abi_cxx11_
                (&local_1a0,
                 (IO *)(ulong)depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_,rule);
      poVar11 = std::operator<<(poVar11,(string *)&local_1a0);
      local_1a4 = (int)std::setw(0xf);
      poVar11 = std::operator<<(poVar11,(_Setw)local_1a4);
      poVar11 = std::operator<<(poVar11,"Pass");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
  }
  else {
    local_1a8 = (int)std::setw(10);
    poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_1a8);
    poVar11 = std::operator<<(poVar11,"Rule");
    local_1ac = (int)std::setw(0x23);
    poVar11 = std::operator<<(poVar11,(_Setw)local_1ac);
    TasGrid::IO::getRuleString_abi_cxx11_
              ((string *)&oned_1,
               (IO *)(ulong)depths1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,rule_00);
    poVar11 = std::operator<<(poVar11,(string *)&oned_1);
    depths1_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,depths1_1.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar11 = std::operator<<(poVar11,"FAIL");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&oned_1);
    bVar4 = false;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  depths1_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = rule_localp;
  tols1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 8;
  paVar1 = (allocator<int> *)
           ((long)&tols1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1f0,0x1e,
             (value_type_conflict2 *)
             ((long)&tols1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&tols1_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  memcpy(local_310,&DAT_0018d4e0,0xf0);
  local_218 = 0x1e;
  local_220 = local_310;
  std::allocator<double>::allocator(&local_311);
  __l_01._M_len = local_218;
  __l_01._M_array = local_220;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_210,__l_01,&local_311);
  std::allocator<double>::~allocator(&local_311);
  TVar6 = (TypeOneDRule)
          depths1_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_1f0);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_210);
  bVar7 = testLocalPolynomialRule(this,&(this->f21nx2).super_BaseFunction,TVar6,piVar9,pdVar10);
  if (bVar7) {
    if ((this->verbose & 1U) != 0) {
      local_318 = (int)std::setw(10);
      poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_318);
      poVar11 = std::operator<<(poVar11,"Rule");
      local_31c = (int)std::setw(0x23);
      poVar11 = std::operator<<(poVar11,(_Setw)local_31c);
      TasGrid::IO::getRuleString_abi_cxx11_
                (&local_340,
                 (IO *)(ulong)(TypeOneDRule)
                              depths1_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,rule_01);
      poVar11 = std::operator<<(poVar11,(string *)&local_340);
      local_344 = (int)std::setw(0xf);
      poVar11 = std::operator<<(poVar11,(_Setw)local_344);
      poVar11 = std::operator<<(poVar11,"Pass");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_340);
    }
  }
  else {
    local_348 = (int)std::setw(10);
    poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_348);
    poVar11 = std::operator<<(poVar11,"Rule");
    local_34c = (int)std::setw(0x23);
    poVar11 = std::operator<<(poVar11,(_Setw)local_34c);
    TasGrid::IO::getRuleString_abi_cxx11_
              ((string *)&oned_2,
               (IO *)(ulong)(TypeOneDRule)
                            depths1_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,rule_02);
    poVar11 = std::operator<<(poVar11,(string *)&oned_2);
    depths1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,depths1_2.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar11 = std::operator<<(poVar11,"FAIL");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&oned_2);
    bVar4 = false;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_210);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1f0);
  depths1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = rule_localpb;
  tols1_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 8;
  paVar1 = (allocator<int> *)
           ((long)&tols1_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_390,0x1e,
             (value_type_conflict2 *)
             ((long)&tols1_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&tols1_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  memcpy(local_4b0,&DAT_0018d5d0,0xf0);
  local_3b8 = 0x1e;
  local_3c0 = local_4b0;
  std::allocator<double>::allocator(&local_4b1);
  __l_00._M_len = local_3b8;
  __l_00._M_array = local_3c0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_3b0,__l_00,&local_4b1);
  std::allocator<double>::~allocator(&local_4b1);
  TVar6 = (TypeOneDRule)
          depths1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_390);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_3b0);
  bVar7 = testLocalPolynomialRule
                    (this,&(this->f21sincosaxis).super_BaseFunction,TVar6,piVar9,pdVar10);
  if (bVar7) {
    if ((this->verbose & 1U) != 0) {
      local_4b8 = (int)std::setw(10);
      poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_4b8);
      poVar11 = std::operator<<(poVar11,"Rule");
      local_4bc = (int)std::setw(0x23);
      poVar11 = std::operator<<(poVar11,(_Setw)local_4bc);
      TasGrid::IO::getRuleString_abi_cxx11_
                (&local_4e0,
                 (IO *)(ulong)(TypeOneDRule)
                              depths1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,rule_03);
      poVar11 = std::operator<<(poVar11,(string *)&local_4e0);
      local_4e4 = (int)std::setw(0xf);
      poVar11 = std::operator<<(poVar11,(_Setw)local_4e4);
      poVar11 = std::operator<<(poVar11,"Pass");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
  }
  else {
    local_4e8 = (int)std::setw(10);
    poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_4e8);
    poVar11 = std::operator<<(poVar11,"Rule");
    local_4ec = (int)std::setw(0x23);
    poVar11 = std::operator<<(poVar11,(_Setw)local_4ec);
    TasGrid::IO::getRuleString_abi_cxx11_
              ((string *)&oned_3,
               (IO *)(ulong)(TypeOneDRule)
                            depths1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,rule_04);
    poVar11 = std::operator<<(poVar11,(string *)&oned_3);
    depths1_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,depths1_3.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar11 = std::operator<<(poVar11,"FAIL");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&oned_3);
    bVar4 = false;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_3b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_390);
  depths1_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = rule_localp0;
  tols1_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 8;
  paVar1 = (allocator<int> *)
           ((long)&tols1_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_530,0x1e,
             (value_type_conflict2 *)
             ((long)&tols1_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&tols1_3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  memcpy(local_650,&DAT_0018d6c0,0xf0);
  local_558 = 0x1e;
  local_560 = local_650;
  std::allocator<double>::allocator(&local_651);
  __l._M_len = local_558;
  __l._M_array = local_560;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_550,__l,&local_651);
  std::allocator<double>::~allocator(&local_651);
  TVar6 = (TypeOneDRule)
          depths1_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  piVar9 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_530);
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_550);
  bVar7 = testLocalPolynomialRule(this,&(this->f21coscos).super_BaseFunction,TVar6,piVar9,pdVar10);
  if (bVar7) {
    if ((this->verbose & 1U) != 0) {
      local_658 = (int)std::setw(10);
      poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_658);
      poVar11 = std::operator<<(poVar11,"Rule");
      local_65c = (int)std::setw(0x23);
      poVar11 = std::operator<<(poVar11,(_Setw)local_65c);
      TasGrid::IO::getRuleString_abi_cxx11_
                (&local_680,
                 (IO *)(ulong)(TypeOneDRule)
                              depths1_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,rule_05);
      poVar11 = std::operator<<(poVar11,(string *)&local_680);
      local_684 = (int)std::setw(0xf);
      poVar11 = std::operator<<(poVar11,(_Setw)local_684);
      poVar11 = std::operator<<(poVar11,"Pass");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_680);
    }
  }
  else {
    local_688 = (int)std::setw(10);
    poVar11 = std::operator<<((ostream *)&std::cout,(_Setw)local_688);
    poVar11 = std::operator<<(poVar11,"Rule");
    local_68c = (int)std::setw(0x23);
    poVar11 = std::operator<<(poVar11,(_Setw)local_68c);
    TasGrid::IO::getRuleString_abi_cxx11_
              (&local_6b0,
               (IO *)(ulong)(TypeOneDRule)
                            depths1_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,rule_06);
    poVar11 = std::operator<<(poVar11,(string *)&local_6b0);
    _Var8 = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,_Var8);
    poVar11 = std::operator<<(poVar11,"FAIL");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_6b0);
    bVar4 = false;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_550);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_530);
  indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_00);
  TasGrid::makeLocalPolynomialGrid
            (local_738,2,1,4,1,rule_localp,(vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  genRandom((vector<double,_std::allocator<double>_> *)local_7b8,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)local_738,(vector *)local_7b8,
             (vector *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_7d8);
  getError(this,&(this->f21nx2).super_BaseFunction,(TasmanianSparseGrid *)local_738,
           type_internal_interpolation,&local_7d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_7d8);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  std::allocator<double>::allocator((allocator<double> *)((long)&j + 3));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,10,(allocator<double> *)((long)&j + 3));
  std::allocator<double>::~allocator((allocator<double> *)((long)&j + 3));
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)local_7b8);
  std::vector<double,_std::allocator<double>_>::data((vector<double,_std::allocator<double>_> *)&i);
  TasGrid::TasmanianSparseGrid::evaluateBatch((double *)local_738,(int)pdVar10,(double *)0xa);
  for (i_1 = 0; i_1 < 10; i_1 = i_1 + 1) {
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_1);
    for (local_814 = *pvVar12;
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)(i_1 + 1)),
        pdVar5 = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, local_814 < *pvVar12;
        local_814 = local_814 + 1) {
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)
                           &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_814);
      dVar2 = pdVar5[*pvVar12];
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_814);
      dVar3 = *pvVar13;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i,(long)i_1);
      *pvVar13 = -dVar2 * dVar3 + *pvVar13;
    }
  }
  for (local_818 = 0; local_818 < 10; local_818 = local_818 + 1) {
    this_01 = (vector<double,_std::allocator<double>_> *)&i;
    std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_818);
    std::abs((int)this_01);
    if (1e-12 < extraout_XMM0_Qa) {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "Error in evaluateSparseHierarchicalFunctions() (localp)");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      bVar4 = false;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_7b8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_738);
  if (bVar4 == false) {
    _Var8 = std::setw(0xb);
    poVar11 = std::operator<<((ostream *)&std::cout,_Var8);
    poVar11 = std::operator<<(poVar11,"Rules");
    _Var8 = std::setw(0x22);
    poVar11 = std::operator<<(poVar11,_Var8);
    poVar11 = std::operator<<(poVar11,"local polynomial");
    _Var8 = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,_Var8);
    poVar11 = std::operator<<(poVar11,"FAIL");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  else {
    _Var8 = std::setw(0xb);
    poVar11 = std::operator<<((ostream *)&std::cout,_Var8);
    poVar11 = std::operator<<(poVar11,"Rules");
    _Var8 = std::setw(0x22);
    poVar11 = std::operator<<(poVar11,_Var8);
    poVar11 = std::operator<<(poVar11,"local polynomial");
    _Var8 = std::setw(0xf);
    poVar11 = std::operator<<(poVar11,_Var8);
    poVar11 = std::operator<<(poVar11,"Pass");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
  }
  return bVar4;
}

Assistant:

bool ExternalTester::testAllPWLocal() const{
    bool pass = true;
    int wfirst = 10, wsecond = 35, wthird = 15;

    { TasGrid::TypeOneDRule oned = TasGrid::rule_semilocalp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for semi-local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 1.E-01, 1.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-03, 1.E-03, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-04, 1.E-04, // order 3
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05, // order 4
                                          1.E-07, 4.E-06, 4.E-06, 4.E-05, 4.E-05 }; // order -1
      if (testLocalPolynomialRule(&f21nx2, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localpb;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-boundary quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 1.E-03, 1.E-03, 5.E-01, 5.E-01, // order 1
                                          1.E-07, 1.E-04, 1.E-04, 1.E-02, 1.E-02, // order 2
                                          1.E-07, 1.E-05, 1.E-05, 1.E-03, 1.E-03, // order 3
                                          1.E-07, 9.E-06, 9.E-06, 9.E-05, 9.E-05, // order 4
                                          1.E-06, 2.E-05, 2.E-05, 2.E-04, 2.E-04 }; // order -1
      if (testLocalPolynomialRule(&f21sincosaxis, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TypeOneDRule oned = TasGrid::rule_localp0;
      const std::vector<int> depths1(30, 8);
      // Tolerances for local-zero quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
      const std::vector<double> tols1 = { 1.E-03, 5.E-01, 5.E-01, 5.E-01, 5.E-01, // order 0
                                          1.E-03, 2.E-04, 2.E-04, 2.E-02, 2.E-02, // order 1
                                          1.E-09, 1.E-06, 1.E-06, 1.E-04, 1.E-04, // order 2
                                          1.E-09, 3.E-08, 3.E-08, 3.E-06, 3.E-06, // order 3
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08, // order 4
                                          1.E-09, 4.E-09, 4.E-09, 4.E-08, 4.E-08}; // order -1
      if (testLocalPolynomialRule(&f21coscos, oned, depths1.data(), tols1.data())){
          if (verbose) cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "Pass" << endl;
      }else{
          cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(oned) << setw(wthird) << "FAIL" << endl; pass = false;
      }
    }
    { TasGrid::TasmanianSparseGrid grid = makeLocalPolynomialGrid(2, 1, 4, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (localp)" << endl;
                pass = false;
            }
        }
    }
    wfirst = 11; wsecond = 34;
    if (pass){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }
    return pass;
}